

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::sortTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__,
                IConfig *config,
                vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unsortedTestCases)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  iterator __first;
  iterator __last;
  size_type sVar4;
  iterator iVar5;
  iterator iVar6;
  reference ppVar7;
  pair<unsigned_long,_const_Catch::TestCase_*> *hashed;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
  *__range3_1;
  reference local_98;
  uint32_t local_8c;
  reference local_88;
  TestCase *testCase;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range3;
  vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
  indexed_tests;
  TestHasher h;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unsortedTestCases_local;
  IConfig *config_local;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *sorted;
  
  iVar2 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])();
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
                (__return_storage_ptr__,unsortedTestCases);
      __first = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                          (__return_storage_ptr__);
      __last = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                         (__return_storage_ptr__);
      std::
      sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>>
                ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  )__first._M_current,
                 (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  )__last._M_current);
      return __return_storage_ptr__;
    }
    if (iVar2 == 2) {
      seedRng(config);
      uVar3 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x11])();
      anon_unknown_2::TestHasher::TestHasher
                ((TestHasher *)
                 &indexed_tests.
                  super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
      clara::std::
      vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
      ::vector((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                *)&__range3);
      sVar4 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size
                        (unsortedTestCases);
      clara::std::
      vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
      ::reserve((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                 *)&__range3,sVar4);
      __end3 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                         (unsortedTestCases);
      testCase = (TestCase *)
                 clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                           (unsortedTestCases);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                         *)&testCase), bVar1) {
        local_88 = __gnu_cxx::
                   __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                   ::operator*(&__end3);
        local_8c = anon_unknown_2::TestHasher::operator()
                             ((TestHasher *)
                              &indexed_tests.
                               super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_88);
        local_98 = local_88;
        std::
        vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>
        ::emplace_back<unsigned_int,Catch::TestCase_const*>
                  ((vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>
                    *)&__range3,&local_8c,&local_98);
        __gnu_cxx::
        __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
        ::operator++(&__end3);
      }
      iVar5 = clara::std::
              vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
              ::begin((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                       *)&__range3);
      iVar6 = clara::std::
              vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
              ::end((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                     *)&__range3);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>
                (iVar5._M_current,iVar6._M_current);
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
                (__return_storage_ptr__);
      sVar4 = clara::std::
              vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
              ::size((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                      *)&__range3);
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
                (__return_storage_ptr__,sVar4);
      __end3_1 = clara::std::
                 vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                 ::begin((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                          *)&__range3);
      hashed = (pair<unsigned_long,_const_Catch::TestCase_*> *)
               clara::std::
               vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
               ::end((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                      *)&__range3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
                                 *)&hashed), bVar1) {
        ppVar7 = __gnu_cxx::
                 __normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
                 ::operator*(&__end3_1);
        std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>::
        emplace_back<Catch::TestCase_const&>
                  ((vector<Catch::TestCase,std::allocator<Catch::TestCase>> *)__return_storage_ptr__
                   ,ppVar7->second);
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
        ::operator++(&__end3_1);
      }
      clara::std::
      vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
      ::~vector((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                 *)&__range3);
      return __return_storage_ptr__;
    }
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            (__return_storage_ptr__,unsortedTestCases);
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCase> sortTests( IConfig const& config, std::vector<TestCase> const& unsortedTestCases ) {
        switch( config.runOrder() ) {
            case RunTests::InDeclarationOrder:
                // already in declaration order
                break;

            case RunTests::InLexicographicalOrder: {
                std::vector<TestCase> sorted = unsortedTestCases;
                std::sort( sorted.begin(), sorted.end() );
                return sorted;
            }

            case RunTests::InRandomOrder: {
                seedRng( config );
                TestHasher h{ config.rngSeed() };

                using hashedTest = std::pair<TestHasher::hash_t, TestCase const*>;
                std::vector<hashedTest> indexed_tests;
                indexed_tests.reserve( unsortedTestCases.size() );

                for (auto const& testCase : unsortedTestCases) {
                    indexed_tests.emplace_back(h(testCase), &testCase);
                }

                std::sort(indexed_tests.begin(), indexed_tests.end(),
                          [](hashedTest const& lhs, hashedTest const& rhs) {
                          if (lhs.first == rhs.first) {
                              return lhs.second->name < rhs.second->name;
                          }
                          return lhs.first < rhs.first;
                });

                std::vector<TestCase> sorted;
                sorted.reserve( indexed_tests.size() );

                for (auto const& hashed : indexed_tests) {
                    sorted.emplace_back(*hashed.second);
                }

                return sorted;
            }
        }
        return unsortedTestCases;
    }